

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwt.c
# Opt level: O2

void opj_idwt53_v(opj_dwt_t *dwt,OPJ_INT32 *tiledp_col,OPJ_SIZE_T stride,OPJ_INT32 nb_cols)

{
  int *piVar1;
  OPJ_INT32 *pOVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  int iVar6;
  long lVar7;
  OPJ_INT32 OVar8;
  int iVar9;
  ulong uVar10;
  OPJ_INT32 *pOVar11;
  int *piVar12;
  long lVar13;
  uint len;
  int iVar14;
  long lVar15;
  ulong uVar16;
  bool bVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  int iVar38;
  int iVar39;
  int iVar40;
  int iVar41;
  int iVar42;
  int iVar43;
  int iVar44;
  long lStack_80;
  
  iVar4 = dwt->sn;
  lVar7 = (long)iVar4;
  len = dwt->dn + iVar4;
  uVar16 = (ulong)len;
  if (dwt->cas == 0) {
    if (nb_cols == 8 && 1 < (int)len) {
      pOVar2 = dwt->mem;
      if (((ulong)pOVar2 & 0xf) != 0) {
        __assert_fail("(OPJ_SIZE_T)tmp % (sizeof(OPJ_INT32) * VREG_INT_COUNT) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/dwt.c"
                      ,0x29d,
                      "void opj_idwt53_v_cas0_mcols_SSE2_OR_AVX2(OPJ_INT32 *, const OPJ_INT32, const OPJ_INT32, OPJ_INT32 *, const OPJ_SIZE_T)"
                     );
      }
      piVar12 = tiledp_col + lVar7 * stride;
      piVar5 = tiledp_col + lVar7 * stride + 4;
      lVar15 = (lVar7 * 4 + 4) * stride;
      lVar7 = 4;
      uVar16 = 0;
      iVar4 = *piVar12;
      iVar28 = piVar12[1];
      iVar3 = piVar12[2];
      iVar6 = piVar12[3];
      iVar9 = *piVar5;
      iVar18 = piVar5[1];
      iVar14 = piVar5[2];
      iVar19 = piVar5[3];
      iVar29 = tiledp_col[4] - (*piVar5 * 2 + 2 >> 2);
      iVar30 = tiledp_col[5] - (piVar5[1] * 2 + 2 >> 2);
      iVar31 = tiledp_col[6] - (piVar5[2] * 2 + 2 >> 2);
      iVar20 = tiledp_col[7] - (piVar5[3] * 2 + 2 >> 2);
      iVar21 = *tiledp_col - (*piVar12 * 2 + 2 >> 2);
      iVar22 = tiledp_col[1] - (piVar12[1] * 2 + 2 >> 2);
      iVar23 = tiledp_col[2] - (piVar12[2] * 2 + 2 >> 2);
      iVar24 = tiledp_col[3] - (piVar12[3] * 2 + 2 >> 2);
      for (lVar13 = 0; lVar13 < (int)(len - 3); lVar13 = lVar13 + 2) {
        piVar1 = tiledp_col + stride + lVar7 + -4;
        piVar12 = tiledp_col + stride + lVar7;
        piVar5 = (int *)((long)tiledp_col + lVar7 * 4 + lVar15 + -0x10);
        iVar25 = *piVar5;
        iVar26 = piVar5[1];
        iVar27 = piVar5[2];
        iVar32 = piVar5[3];
        piVar5 = (int *)((long)tiledp_col + lVar7 * 4 + lVar15);
        iVar33 = *piVar5;
        iVar34 = piVar5[1];
        iVar35 = piVar5[2];
        iVar36 = piVar5[3];
        iVar41 = *piVar1 - (iVar4 + iVar25 + 2 >> 2);
        iVar42 = piVar1[1] - (iVar28 + iVar26 + 2 >> 2);
        iVar43 = piVar1[2] - (iVar3 + iVar27 + 2 >> 2);
        iVar44 = piVar1[3] - (iVar6 + iVar32 + 2 >> 2);
        iVar37 = *piVar12 - (iVar9 + iVar33 + 2 >> 2);
        iVar38 = piVar12[1] - (iVar18 + iVar34 + 2 >> 2);
        iVar39 = piVar12[2] - (iVar14 + iVar35 + 2 >> 2);
        iVar40 = piVar12[3] - (iVar19 + iVar36 + 2 >> 2);
        pOVar11 = pOVar2 + uVar16;
        *pOVar11 = iVar21;
        pOVar11[1] = iVar22;
        pOVar11[2] = iVar23;
        pOVar11[3] = iVar24;
        pOVar11 = pOVar2 + uVar16 + 4;
        *pOVar11 = iVar29;
        pOVar11[1] = iVar30;
        pOVar11[2] = iVar31;
        pOVar11[3] = iVar20;
        pOVar11 = pOVar2 + uVar16 + 8;
        *pOVar11 = (iVar21 + iVar41 >> 1) + iVar4;
        pOVar11[1] = (iVar22 + iVar42 >> 1) + iVar28;
        pOVar11[2] = (iVar23 + iVar43 >> 1) + iVar3;
        pOVar11[3] = (iVar24 + iVar44 >> 1) + iVar6;
        pOVar11 = pOVar2 + uVar16 + 0xc;
        *pOVar11 = (iVar29 + iVar37 >> 1) + iVar9;
        pOVar11[1] = (iVar30 + iVar38 >> 1) + iVar18;
        pOVar11[2] = (iVar31 + iVar39 >> 1) + iVar14;
        pOVar11[3] = (iVar20 + iVar40 >> 1) + iVar19;
        uVar16 = uVar16 + 0x10;
        lVar7 = lVar7 + stride;
        iVar4 = iVar25;
        iVar28 = iVar26;
        iVar3 = iVar27;
        iVar6 = iVar32;
        iVar9 = iVar33;
        iVar18 = iVar34;
        iVar14 = iVar35;
        iVar19 = iVar36;
        iVar29 = iVar37;
        iVar30 = iVar38;
        iVar31 = iVar39;
        iVar20 = iVar40;
        iVar21 = iVar41;
        iVar22 = iVar42;
        iVar23 = iVar43;
        iVar24 = iVar44;
      }
      pOVar11 = pOVar2 + (uVar16 & 0xffffffff);
      *pOVar11 = iVar21;
      pOVar11[1] = iVar22;
      pOVar11[2] = iVar23;
      pOVar11[3] = iVar24;
      pOVar11 = pOVar2 + (uVar16 & 0xffffffff) + 4;
      *pOVar11 = iVar29;
      pOVar11[1] = iVar30;
      pOVar11[2] = iVar31;
      pOVar11[3] = iVar20;
      if ((len & 1) == 0) {
        uVar16 = (ulong)(len * 8 - 8);
        pOVar11 = pOVar2 + uVar16;
        *pOVar11 = iVar21 + iVar4;
        pOVar11[1] = iVar22 + iVar28;
        pOVar11[2] = iVar23 + iVar3;
        pOVar11[3] = iVar24 + iVar6;
        pOVar11 = pOVar2 + uVar16 + 4;
        *pOVar11 = iVar29 + iVar9;
        pOVar11[1] = iVar30 + iVar18;
        pOVar11[2] = iVar31 + iVar14;
        pOVar11[3] = iVar20 + iVar19;
      }
      else {
        lVar7 = (len - 1 >> 1) * stride;
        piVar12 = tiledp_col + lVar7;
        iVar25 = *piVar12 - (iVar4 * 2 + 2 >> 2);
        iVar26 = piVar12[1] - (iVar28 * 2 + 2 >> 2);
        iVar27 = piVar12[2] - (iVar3 * 2 + 2 >> 2);
        iVar32 = piVar12[3] - (iVar6 * 2 + 2 >> 2);
        uVar16 = (ulong)(len * 8 - 8);
        pOVar11 = pOVar2 + uVar16;
        *pOVar11 = iVar25;
        pOVar11[1] = iVar26;
        pOVar11[2] = iVar27;
        pOVar11[3] = iVar32;
        uVar10 = (ulong)(len * 8 - 0x10);
        pOVar11 = pOVar2 + uVar10;
        *pOVar11 = (iVar25 + iVar21 >> 1) + iVar4;
        pOVar11[1] = (iVar26 + iVar22 >> 1) + iVar28;
        pOVar11[2] = (iVar27 + iVar23 >> 1) + iVar3;
        pOVar11[3] = (iVar32 + iVar24 >> 1) + iVar6;
        piVar12 = tiledp_col + lVar7 + 4;
        iVar4 = *piVar12 - (iVar9 * 2 + 2 >> 2);
        iVar28 = piVar12[1] - (iVar18 * 2 + 2 >> 2);
        iVar3 = piVar12[2] - (iVar14 * 2 + 2 >> 2);
        iVar6 = piVar12[3] - (iVar19 * 2 + 2 >> 2);
        pOVar11 = pOVar2 + uVar16 + 4;
        *pOVar11 = iVar4;
        pOVar11[1] = iVar28;
        pOVar11[2] = iVar3;
        pOVar11[3] = iVar6;
        pOVar11 = pOVar2 + uVar10 + 4;
        *pOVar11 = (iVar4 + iVar29 >> 1) + iVar9;
        pOVar11[1] = (iVar28 + iVar30 >> 1) + iVar18;
        pOVar11[2] = (iVar3 + iVar31 >> 1) + iVar14;
        pOVar11[3] = (iVar6 + iVar20 >> 1) + iVar19;
      }
LAB_0010c9bb:
      opj_idwt53_v_final_memcpy(tiledp_col,pOVar2,len,stride);
      return;
    }
    if (1 < (int)len) {
      iVar28 = 0;
      if (nb_cols < 1) {
        nb_cols = iVar28;
      }
      piVar12 = tiledp_col + stride;
      for (; iVar28 != nb_cols; iVar28 = iVar28 + 1) {
        pOVar2 = dwt->mem;
        piVar5 = piVar12;
        iVar6 = tiledp_col[lVar7 * stride];
        iVar9 = *tiledp_col - (tiledp_col[lVar7 * stride] + 1 >> 1);
        iVar3 = iVar4;
        for (lVar13 = 0; iVar3 = iVar3 + 1, lVar13 < (int)(len - 3); lVar13 = lVar13 + 2) {
          iVar18 = tiledp_col[(long)iVar3 * stride];
          iVar14 = *piVar5 - (iVar6 + iVar18 + 2 >> 2);
          pOVar2[lVar13] = iVar9;
          pOVar2[lVar13 + 1] = (iVar9 + iVar14 >> 1) + iVar6;
          piVar5 = piVar5 + stride;
          iVar6 = iVar18;
          iVar9 = iVar14;
        }
        pOVar2[lVar13] = iVar9;
        if ((len & 1) == 0) {
          lStack_80 = -4;
        }
        else {
          iVar3 = tiledp_col[(len - 1 >> 1) * stride] - (iVar6 + 1 >> 1);
          pOVar2[len - 1] = iVar3;
          iVar9 = iVar3 + iVar9 >> 1;
          lStack_80 = -8;
        }
        *(int *)((long)pOVar2 + lStack_80 + uVar16 * 4) = iVar9 + iVar6;
        piVar5 = tiledp_col;
        for (uVar10 = 0; uVar16 != uVar10; uVar10 = uVar10 + 1) {
          *piVar5 = pOVar2[uVar10];
          piVar5 = piVar5 + stride;
        }
        tiledp_col = tiledp_col + 1;
        piVar12 = piVar12 + 1;
      }
    }
  }
  else if (len == 2) {
    piVar12 = dwt->mem;
    OVar8 = 0;
    if (0 < nb_cols) {
      OVar8 = nb_cols;
    }
    while (bVar17 = OVar8 != 0, OVar8 = OVar8 + -1, bVar17) {
      iVar4 = *tiledp_col - (tiledp_col[lVar7 * stride] + 1 >> 1);
      piVar12[1] = iVar4;
      iVar4 = iVar4 + tiledp_col[lVar7 * stride];
      *piVar12 = iVar4;
      *tiledp_col = iVar4;
      tiledp_col[stride] = piVar12[1];
      tiledp_col = tiledp_col + 1;
    }
  }
  else if (len == 1) {
    lVar7 = 0;
    if (nb_cols < 1) {
      nb_cols = 0;
    }
    for (; nb_cols != (int)lVar7; lVar7 = lVar7 + 1) {
      tiledp_col[lVar7] = tiledp_col[lVar7] / 2;
    }
  }
  else {
    if (nb_cols == 8 && 2 < (int)len) {
      pOVar2 = dwt->mem;
      if (((ulong)pOVar2 & 0xf) != 0) {
        __assert_fail("(OPJ_SIZE_T)tmp % (sizeof(OPJ_INT32) * VREG_INT_COUNT) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/dwt.c"
                      ,0x303,
                      "void opj_idwt53_v_cas1_mcols_SSE2_OR_AVX2(OPJ_INT32 *, const OPJ_INT32, const OPJ_INT32, OPJ_INT32 *, const OPJ_SIZE_T)"
                     );
      }
      piVar12 = tiledp_col + lVar7 * stride;
      piVar5 = piVar12 + stride;
      iVar4 = *piVar5;
      iVar28 = piVar5[1];
      iVar3 = piVar5[2];
      iVar6 = piVar5[3];
      iVar9 = piVar12[1];
      iVar18 = piVar12[2];
      iVar14 = piVar12[3];
      iVar24 = *tiledp_col - (iVar4 + *piVar12 + 2 >> 2);
      iVar25 = tiledp_col[1] - (iVar28 + iVar9 + 2 >> 2);
      iVar26 = tiledp_col[2] - (iVar3 + iVar18 + 2 >> 2);
      iVar27 = tiledp_col[3] - (iVar6 + iVar14 + 2 >> 2);
      *pOVar2 = *piVar12 + iVar24;
      pOVar2[1] = iVar9 + iVar25;
      pOVar2[2] = iVar18 + iVar26;
      pOVar2[3] = iVar14 + iVar27;
      piVar5 = piVar12 + stride + 4;
      iVar9 = *piVar5;
      iVar18 = piVar5[1];
      iVar14 = piVar5[2];
      iVar19 = piVar5[3];
      iVar29 = piVar12[5];
      iVar30 = piVar12[6];
      iVar31 = piVar12[7];
      iVar20 = tiledp_col[4] - (iVar9 + piVar12[4] + 2 >> 2);
      iVar21 = tiledp_col[5] - (iVar18 + iVar29 + 2 >> 2);
      iVar22 = tiledp_col[6] - (iVar14 + iVar30 + 2 >> 2);
      iVar23 = tiledp_col[7] - (iVar19 + iVar31 + 2 >> 2);
      pOVar2[4] = piVar12[4] + iVar20;
      pOVar2[5] = iVar29 + iVar21;
      pOVar2[6] = iVar30 + iVar22;
      pOVar2[7] = iVar31 + iVar23;
      lVar15 = (lVar7 * 4 + 8) * stride;
      uVar10 = 8;
      lVar7 = 4;
      lVar13 = 0x1000000000;
      for (uVar16 = 1; uVar16 < (len - (len & 1 ^ 1)) - 2; uVar16 = uVar16 + 2) {
        piVar12 = (int *)((long)tiledp_col + lVar7 * 4 + lVar15 + -0x10);
        iVar29 = *piVar12;
        iVar30 = piVar12[1];
        iVar31 = piVar12[2];
        iVar32 = piVar12[3];
        piVar12 = (int *)((long)tiledp_col + lVar7 * 4 + lVar15);
        iVar33 = *piVar12;
        iVar34 = piVar12[1];
        iVar35 = piVar12[2];
        iVar36 = piVar12[3];
        piVar12 = tiledp_col + stride + lVar7 + -4;
        iVar37 = *piVar12 - (iVar4 + iVar29 + 2 >> 2);
        iVar38 = piVar12[1] - (iVar28 + iVar30 + 2 >> 2);
        iVar39 = piVar12[2] - (iVar3 + iVar31 + 2 >> 2);
        iVar40 = piVar12[3] - (iVar6 + iVar32 + 2 >> 2);
        piVar12 = tiledp_col + stride + lVar7;
        iVar41 = *piVar12 - (iVar9 + iVar33 + 2 >> 2);
        iVar42 = piVar12[1] - (iVar18 + iVar34 + 2 >> 2);
        iVar43 = piVar12[2] - (iVar14 + iVar35 + 2 >> 2);
        iVar44 = piVar12[3] - (iVar19 + iVar36 + 2 >> 2);
        pOVar11 = pOVar2 + uVar10;
        *pOVar11 = iVar24;
        pOVar11[1] = iVar25;
        pOVar11[2] = iVar26;
        pOVar11[3] = iVar27;
        pOVar11 = pOVar2 + uVar10 + 4;
        *pOVar11 = iVar20;
        pOVar11[1] = iVar21;
        pOVar11[2] = iVar22;
        pOVar11[3] = iVar23;
        piVar12 = (int *)((long)pOVar2 + (lVar13 >> 0x1e));
        *piVar12 = (iVar24 + iVar37 >> 1) + iVar4;
        piVar12[1] = (iVar25 + iVar38 >> 1) + iVar28;
        piVar12[2] = (iVar26 + iVar39 >> 1) + iVar3;
        piVar12[3] = (iVar27 + iVar40 >> 1) + iVar6;
        piVar12 = (int *)((long)pOVar2 + (lVar13 >> 0x1e) + 0x10);
        *piVar12 = (iVar20 + iVar41 >> 1) + iVar9;
        piVar12[1] = (iVar21 + iVar42 >> 1) + iVar18;
        piVar12[2] = (iVar22 + iVar43 >> 1) + iVar14;
        piVar12[3] = (iVar23 + iVar44 >> 1) + iVar19;
        uVar10 = uVar10 + 0x10;
        lVar13 = lVar13 + 0x1000000000;
        lVar7 = lVar7 + stride;
        iVar4 = iVar29;
        iVar28 = iVar30;
        iVar3 = iVar31;
        iVar6 = iVar32;
        iVar9 = iVar33;
        iVar18 = iVar34;
        iVar14 = iVar35;
        iVar19 = iVar36;
        iVar20 = iVar41;
        iVar21 = iVar42;
        iVar22 = iVar43;
        iVar23 = iVar44;
        iVar24 = iVar37;
        iVar25 = iVar38;
        iVar26 = iVar39;
        iVar27 = iVar40;
      }
      pOVar11 = pOVar2 + (uVar10 & 0xffffffff);
      *pOVar11 = iVar24;
      pOVar11[1] = iVar25;
      pOVar11[2] = iVar26;
      pOVar11[3] = iVar27;
      pOVar11 = pOVar2 + (uVar10 & 0xffffffff) + 4;
      *pOVar11 = iVar20;
      pOVar11[1] = iVar21;
      pOVar11[2] = iVar22;
      pOVar11[3] = iVar23;
      if ((len & 1) == 0) {
        lVar7 = ((len >> 1) - 1) * stride;
        piVar12 = tiledp_col + lVar7;
        iVar33 = *piVar12 - (iVar4 * 2 + 2 >> 2);
        iVar34 = piVar12[1] - (iVar28 * 2 + 2 >> 2);
        iVar35 = piVar12[2] - (iVar3 * 2 + 2 >> 2);
        iVar36 = piVar12[3] - (iVar6 * 2 + 2 >> 2);
        piVar12 = tiledp_col + lVar7 + 4;
        iVar29 = *piVar12 - (iVar9 * 2 + 2 >> 2);
        iVar30 = piVar12[1] - (iVar18 * 2 + 2 >> 2);
        iVar31 = piVar12[2] - (iVar14 * 2 + 2 >> 2);
        iVar32 = piVar12[3] - (iVar19 * 2 + 2 >> 2);
        uVar16 = (ulong)((len - 2) * 8);
        pOVar11 = pOVar2 + uVar16;
        *pOVar11 = (iVar24 + iVar33 >> 1) + iVar4;
        pOVar11[1] = (iVar25 + iVar34 >> 1) + iVar28;
        pOVar11[2] = (iVar26 + iVar35 >> 1) + iVar3;
        pOVar11[3] = (iVar27 + iVar36 >> 1) + iVar6;
        pOVar11 = pOVar2 + uVar16 + 4;
        *pOVar11 = (iVar20 + iVar29 >> 1) + iVar9;
        pOVar11[1] = (iVar21 + iVar30 >> 1) + iVar18;
        pOVar11[2] = (iVar22 + iVar31 >> 1) + iVar14;
        pOVar11[3] = (iVar23 + iVar32 >> 1) + iVar19;
        uVar16 = (ulong)(len * 8 - 8);
        pOVar11 = pOVar2 + uVar16;
        *pOVar11 = iVar33;
        pOVar11[1] = iVar34;
        pOVar11[2] = iVar35;
        pOVar11[3] = iVar36;
        pOVar11 = pOVar2 + uVar16 + 4;
        *pOVar11 = iVar29;
        pOVar11[1] = iVar30;
        pOVar11[2] = iVar31;
        pOVar11[3] = iVar32;
      }
      else {
        pOVar11 = pOVar2 + (long)(int)(len * 8) + -8;
        *pOVar11 = iVar24 + iVar4;
        pOVar11[1] = iVar25 + iVar28;
        pOVar11[2] = iVar26 + iVar3;
        pOVar11[3] = iVar27 + iVar6;
        pOVar11 = pOVar2 + (long)(int)(len * 8) + -4;
        *pOVar11 = iVar20 + iVar9;
        pOVar11[1] = iVar21 + iVar18;
        pOVar11[2] = iVar22 + iVar14;
        pOVar11[3] = iVar23 + iVar19;
      }
      goto LAB_0010c9bb;
    }
    if (2 < (int)len) {
      iVar4 = 0;
      if (nb_cols < 1) {
        nb_cols = iVar4;
      }
      pOVar2 = tiledp_col + stride;
      pOVar11 = (OPJ_INT32 *)((lVar7 * 4 + 8) * stride + (long)tiledp_col);
      for (; iVar4 != nb_cols; iVar4 = iVar4 + 1) {
        piVar12 = dwt->mem;
        iVar28 = (tiledp_col + lVar7 * stride)[stride];
        iVar3 = tiledp_col[lVar7 * stride];
        iVar6 = *tiledp_col - (iVar28 + iVar3 + 2 >> 2);
        *piVar12 = iVar3 + iVar6;
        lVar13 = 0;
        for (uVar10 = 1; uVar10 < (len - (len & 1 ^ 1)) - 2; uVar10 = uVar10 + 2) {
          iVar3 = pOVar11[lVar13];
          iVar9 = pOVar2[lVar13] - (iVar28 + iVar3 + 2 >> 2);
          piVar12[uVar10] = iVar6;
          piVar12[uVar10 + 1] = (iVar6 + iVar9 >> 1) + iVar28;
          lVar13 = lVar13 + stride;
          iVar28 = iVar3;
          iVar6 = iVar9;
        }
        piVar12[uVar10] = iVar6;
        if ((len & 1) == 0) {
          iVar3 = tiledp_col[((len >> 1) - 1) * stride] - (iVar28 + 1 >> 1);
          piVar12[len - 2] = (iVar6 + iVar3 >> 1) + iVar28;
        }
        else {
          iVar3 = iVar6 + iVar28;
        }
        piVar12[uVar16 - 1] = iVar3;
        piVar5 = tiledp_col;
        for (uVar10 = 0; uVar16 != uVar10; uVar10 = uVar10 + 1) {
          *piVar5 = piVar12[uVar10];
          piVar5 = piVar5 + stride;
        }
        tiledp_col = tiledp_col + 1;
        pOVar2 = pOVar2 + 1;
        pOVar11 = pOVar11 + 1;
      }
    }
  }
  return;
}

Assistant:

static void opj_idwt53_v(const opj_dwt_t *dwt,
                         OPJ_INT32* tiledp_col,
                         OPJ_SIZE_T stride,
                         OPJ_INT32 nb_cols)
{
#ifdef STANDARD_SLOW_VERSION
    /* For documentation purpose */
    OPJ_INT32 k, c;
    for (c = 0; c < nb_cols; c ++) {
        opj_dwt_interleave_v(dwt, tiledp_col + c, stride);
        opj_dwt_decode_1(dwt);
        for (k = 0; k < dwt->sn + dwt->dn; ++k) {
            tiledp_col[c + k * stride] = dwt->mem[k];
        }
    }
#else
    const OPJ_INT32 sn = dwt->sn;
    const OPJ_INT32 len = sn + dwt->dn;
    if (dwt->cas == 0) {
        /* If len == 1, unmodified value */

#if (defined(__SSE2__) || defined(__AVX2__))
        if (len > 1 && nb_cols == PARALLEL_COLS_53) {
            /* Same as below general case, except that thanks to SSE2/AVX2 */
            /* we can efficiently process 8/16 columns in parallel */
            opj_idwt53_v_cas0_mcols_SSE2_OR_AVX2(dwt->mem, sn, len, tiledp_col, stride);
            return;
        }
#endif
        if (len > 1) {
            OPJ_INT32 c;
            for (c = 0; c < nb_cols; c++, tiledp_col++) {
                opj_idwt3_v_cas0(dwt->mem, sn, len, tiledp_col, stride);
            }
            return;
        }
    } else {
        if (len == 1) {
            OPJ_INT32 c;
            for (c = 0; c < nb_cols; c++, tiledp_col++) {
                tiledp_col[0] /= 2;
            }
            return;
        }

        if (len == 2) {
            OPJ_INT32 c;
            OPJ_INT32* out = dwt->mem;
            for (c = 0; c < nb_cols; c++, tiledp_col++) {
                OPJ_INT32 i;
                const OPJ_INT32* in_even = &tiledp_col[(OPJ_SIZE_T)sn * stride];
                const OPJ_INT32* in_odd = &tiledp_col[0];

                out[1] = in_odd[0] - ((in_even[0] + 1) >> 1);
                out[0] = in_even[0] + out[1];

                for (i = 0; i < len; ++i) {
                    tiledp_col[(OPJ_SIZE_T)i * stride] = out[i];
                }
            }

            return;
        }

#if (defined(__SSE2__) || defined(__AVX2__))
        if (len > 2 && nb_cols == PARALLEL_COLS_53) {
            /* Same as below general case, except that thanks to SSE2/AVX2 */
            /* we can efficiently process 8/16 columns in parallel */
            opj_idwt53_v_cas1_mcols_SSE2_OR_AVX2(dwt->mem, sn, len, tiledp_col, stride);
            return;
        }
#endif
        if (len > 2) {
            OPJ_INT32 c;
            for (c = 0; c < nb_cols; c++, tiledp_col++) {
                opj_idwt3_v_cas1(dwt->mem, sn, len, tiledp_col, stride);
            }
            return;
        }
    }
#endif
}